

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trait.cpp
# Opt level: O0

void MeshLib::Trait::updateTraitString(string *traitString,string *traitName,string *traitValue)

{
  string *psVar1;
  ostream *poVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  int local_a4;
  undefined1 local_a0 [4];
  int temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_2c;
  int local_28;
  int sfp;
  int ep;
  int sp;
  string *traitValue_local;
  string *traitName_local;
  string *traitString_local;
  
  _ep = traitValue;
  traitValue_local = traitName;
  traitName_local = traitString;
  std::operator+(&local_70," ",traitName);
  std::operator+(&local_50,&local_70,"=(");
  local_2c = std::__cxx11::string::find((string *)traitString,(ulong)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  psVar1 = traitName_local;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 traitValue_local,"=(");
  sfp = std::__cxx11::string::find((string *)psVar1,(ulong)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  if ((sfp == 0) || (local_2c != -1)) {
    if (sfp == 0) {
      local_a4 = sfp;
    }
    else {
      local_a4 = local_2c;
    }
    sfp = std::__cxx11::string::find_first_of((char *)traitName_local,0x1333ad);
    local_28 = std::__cxx11::string::find_first_of((char *)traitName_local,0x13334c);
    if ((sfp == -1) || (local_28 == -1)) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR: Trait string missing parenthesis: ");
      poVar2 = std::operator<<(poVar2,(string *)traitName_local);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      sfp = sfp + 1;
      local_28 = local_28 + -1;
      std::__cxx11::string::replace
                ((ulong)traitName_local,(long)sfp,(string *)(long)((local_28 - sfp) + 1));
    }
  }
  else {
    lVar3 = std::__cxx11::string::length();
    if (lVar3 == 0) {
      std::operator+(&local_188,traitValue_local,"=(");
      std::operator+(&local_168,&local_188,_ep);
      std::operator+(&local_148,&local_168,")");
      std::__cxx11::string::operator=((string *)traitName_local,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_188);
    }
    else {
      std::operator+(&local_128,traitValue_local,"=(");
      std::operator+(&local_108,&local_128,_ep);
      std::operator+(&local_e8,&local_108,") ");
      std::operator+(&local_c8,&local_e8,traitName_local);
      std::__cxx11::string::operator=((string *)traitName_local,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
    }
  }
  return;
}

Assistant:

void Trait::updateTraitString(std::string &traitString, std::string &traitName, std::string &traitValue)
{
	int sp, ep, sfp;
	sfp = (int)traitString.find(" "+traitName+"=(");
	sp = (int)traitString.find(traitName+"=(");
	if(sp==0 || sfp != (int)std::string::npos)
	{
		int temp;
		if( sp == 0 ) temp = sp;
		else temp = sfp;
		
		sp = (int)traitString.find_first_of("(", temp);
		ep = (int)traitString.find_first_of(")", temp);
		if(sp != (int)std::string::npos && ep != (int)std::string::npos)
		{
			// get inside of the parenthesis
			sp++;
			ep--;
			traitString.replace(sp, ep-sp+1, traitValue);
		}
		else
		{
			// string is corrupt
			std::cerr << "ERROR: Trait string missing parenthesis: " << traitString << std::endl;
			return;
		}
	}
	else
	{
		// trait not present in string
		if(traitString.length())
		{
			traitString = traitName + "=(" + traitValue + ") " + traitString;
		}
		else
		{
			traitString = traitName + "=(" + traitValue + ")";
		}

		return;
	}
}